

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.c
# Opt level: O3

int main(void)

{
  int iVar1;
  int iVar2;
  Suite *pSVar3;
  SRunner *pSVar4;
  
  pSVar3 = private_ACUtilsTest_ADynArray_getTestSuite();
  pSVar4 = srunner_create(pSVar3);
  srunner_set_fork_status(pSVar4,CK_NOFORK);
  srunner_run_all(pSVar4,CK_NORMAL);
  iVar1 = srunner_ntests_failed(pSVar4);
  srunner_free(pSVar4);
  pSVar3 = private_ACUtilsTest_AString_getTestSuite();
  pSVar4 = srunner_create(pSVar3);
  srunner_set_fork_status(pSVar4,CK_NOFORK);
  srunner_run_all(pSVar4,CK_NORMAL);
  iVar2 = srunner_ntests_failed(pSVar4);
  srunner_free(pSVar4);
  return (int)(iVar2 + iVar1 != 0);
}

Assistant:

int main(void)
{
    int numberFailed = 0;
    SRunner *runner;

    runner = srunner_create(private_ACUtilsTest_ADynArray_getTestSuite());
    srunner_set_fork_status(runner, CK_NOFORK);
    srunner_run_all(runner, CK_NORMAL);
    numberFailed += srunner_ntests_failed(runner);
    srunner_free(runner);

    runner = srunner_create(private_ACUtilsTest_AString_getTestSuite());
    srunner_set_fork_status(runner, CK_NOFORK);
    srunner_run_all(runner, CK_NORMAL);
    numberFailed += srunner_ntests_failed(runner);
    srunner_free(runner);

    return (numberFailed == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}